

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  long lVar1;
  int n;
  long lVar2;
  long lVar3;
  
  lVar3 = 8;
  for (lVar2 = 0; lVar2 < (this->Map).Data.Size; lVar2 = lVar2 + 1) {
    lVar1 = (long)*(int *)((long)&((this->Map).Data.Data)->key + lVar3);
    if (lVar1 != -1) {
      ImGuiTabBar::~ImGuiTabBar((this->Buf).Data + lVar1);
    }
    lVar3 = lVar3 + 0x10;
  }
  ImVector<ImGuiStorage::ImGuiStoragePair>::clear(&(this->Map).Data);
  ImVector<ImGuiTabBar>::clear(&this->Buf);
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }